

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  long local_38;
  int64_t limit;
  int strict_local;
  int maxsize_local;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  local_38 = 1L << ((char)s * '\x03' & 0x3fU);
  if (strict == 0) {
    strict_local = s;
    if (-1 < v) {
      for (; strict_local <= maxsize; strict_local = strict_local + 1) {
        if (v < local_38) {
          iVar1 = format_octal(v,p,strict_local);
          return iVar1;
        }
        local_38 = local_38 << 3;
      }
    }
    v_local._4_4_ = format_256(v,p,maxsize);
  }
  else {
    v_local._4_4_ = format_octal(v,p,s);
  }
  return v_local._4_4_;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize)
{
	int64_t limit = ((int64_t)1 << (s*3));

	if (v < limit)
		return (format_octal(v, p, s));
	return (format_256(v, p, maxsize));
}